

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

Literal * wasm::Properties::getLiteral(Literal *__return_storage_ptr__,Expression *curr)

{
  Id IVar1;
  Expression func;
  int32_t value;
  HeapType type;
  string local_58;
  Literal local_38;
  
  IVar1 = curr->_id;
  if (IVar1 == StringConstId) {
    IString::toString_abi_cxx11_(&local_58,(IString *)(curr + 1));
    Literal::Literal(__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else if (IVar1 == RefNullId) {
    Literal::Literal(__return_storage_ptr__,(Type)(curr->type).id);
  }
  else if (IVar1 == RefFuncId) {
    func = curr[1];
    type = wasm::Type::getHeapType(&curr->type);
    Literal::Literal(__return_storage_ptr__,(Name)func,type);
  }
  else if (IVar1 == I31NewId) {
    if (**(int **)(curr + 1) != 0xe) {
LAB_007ace09:
      handle_unreachable("non-constant expression",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/properties.h"
                         ,0x85);
    }
    value = Literal::geti32((Literal *)(*(int **)(curr + 1) + 4));
    Literal::makeI31(__return_storage_ptr__,value);
  }
  else if (IVar1 == RefAsId) {
    if (curr[1]._id == BlockId) {
      getLiteral(&local_38,(Expression *)curr[1].type.id);
      Literal::internalize(__return_storage_ptr__,&local_38);
    }
    else {
      if (curr[1]._id != IfId) goto LAB_007ace09;
      getLiteral(&local_38,(Expression *)curr[1].type.id);
      Literal::externalize(__return_storage_ptr__,&local_38);
    }
    Literal::~Literal(&local_38);
  }
  else {
    if (IVar1 != ConstId) goto LAB_007ace09;
    Literal::Literal(__return_storage_ptr__,(Literal *)(curr + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

inline Literal getLiteral(const Expression* curr) {
  if (auto* c = curr->dynCast<Const>()) {
    return c->value;
  } else if (auto* n = curr->dynCast<RefNull>()) {
    return Literal(n->type);
  } else if (auto* r = curr->dynCast<RefFunc>()) {
    return Literal(r->func, r->type.getHeapType());
  } else if (auto* i = curr->dynCast<I31New>()) {
    if (auto* c = i->value->dynCast<Const>()) {
      return Literal::makeI31(c->value.geti32());
    }
  } else if (auto* s = curr->dynCast<StringConst>()) {
    return Literal(s->string.toString());
  } else if (auto* r = curr->dynCast<RefAs>()) {
    if (r->op == ExternExternalize) {
      return getLiteral(r->value).externalize();
    } else if (r->op == ExternInternalize) {
      return getLiteral(r->value).internalize();
    }
  }
  WASM_UNREACHABLE("non-constant expression");
}